

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O1

void __thiscall CVmImageLoader::load_const_pool_page(CVmImageLoader *this,ulong siz)

{
  CVmImagePool *this_00;
  int iVar1;
  undefined4 extraout_var;
  char buf [32];
  ushort local_48;
  uint local_46;
  uchar local_42;
  
  if (siz < 7) {
    err_throw(0x132);
  }
  (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,&local_48,7);
  if (0xfffffffd < local_48 - 3) {
    this_00 = this->pools_[local_48 - 1];
    iVar1 = (*this->fp_->_vptr_CVmImageFile[8])();
    CVmImagePool::set_page_info
              (this_00,(ulong)local_46,CONCAT44(extraout_var,iVar1),siz - 7,local_42);
    (*this->fp_->_vptr_CVmImageFile[9])(this->fp_,siz - 7);
    return;
  }
  err_throw(0x135);
}

Assistant:

void CVmImageLoader::read_data(char *buf, size_t read_len,
                               ulong *remaining_size)
{
    /* ensure we have enough data left in our block */
    if (read_len > *remaining_size)
        err_throw(VMERR_IMAGE_BLOCK_TOO_SMALL);

    /* decrement the remaining size counter for the data we just read */
    *remaining_size -= read_len;

    /* read the data */
    fp_->copy_data(buf, read_len);
}